

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int i;
  ulong __n;
  bool bVar3;
  long lVar4;
  bool useLinearProgramming;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference rVar5;
  undefined1 local_79;
  vector<bool,_std::allocator<bool>_> vertexCover;
  Graph graph;
  
  bVar3 = false;
  std::ios_base::sync_with_stdio(false);
  useLinearProgramming = false;
  for (lVar4 = 1; lVar4 < argc; lVar4 = lVar4 + 1) {
    std::__cxx11::string::string((string *)&vertexCover,argv[lVar4],(allocator *)&graph);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &vertexCover,"-useLp");
    if (bVar1) {
      useLinearProgramming = true;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &vertexCover,"-anyLpSolution");
      bVar3 = (bool)(bVar3 | bVar1);
    }
    std::__cxx11::string::~string((string *)&vertexCover);
  }
  readGraph(&graph,(istream *)&std::cin);
  Graph::findVertexCover(&vertexCover,&graph,useLinearProgramming,bVar3);
  __last.super__Bit_iterator_base._M_offset =
       vertexCover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_p =
       vertexCover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  local_79 = 1;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       vertexCover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__count_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
            (__first,__last,(_Iter_equals_val<const_bool>)&local_79);
  poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar2,'\n');
  for (__n = 0; __n < (ulong)vertexCover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)vertexCover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)vertexCover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&vertexCover,__n);
    if ((*rVar5._M_p & rVar5._M_mask) != 0) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)__n);
      std::operator<<(poVar2,' ');
    }
  }
  bVar3 = Graph::isVertexCover(&graph,&vertexCover);
  if (bVar3) {
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&vertexCover.super__Bvector_base<std::allocator<bool>_>);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&graph.graph);
    return 0;
  }
  __assert_fail("graph.isVertexCover(vertexCover)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/crismaz[P]vertex-cover/main.cpp"
                ,0x30,"int main(int, char **)");
}

Assistant:

int main(int argc, char* argv[]) {
    std::ios_base::sync_with_stdio(false);

    bool useLinearProgramming = false, anyLpSolution = false;
    for (int index = 1; index < argc; index++) {
        std::string arg(argv[index]);
        if (arg == "-useLp") {
            useLinearProgramming = true;
        } else if (arg == "-anyLpSolution") {
            anyLpSolution = true;
        }
    }

    Graph graph = readGraph();
    auto vertexCover = graph.findVertexCover(useLinearProgramming, anyLpSolution);

    std::cout << std::count(vertexCover.begin(), vertexCover.end(), true) << '\n';
    for (int i = 0; i < vertexCover.size(); i++) {
        if (vertexCover[i]) {
            std::cout << i << ' ';
        }
    }

    assert(graph.isVertexCover(vertexCover)); // check that a valid vertex cover was found

    return 0;
}